

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_reader_tests.cpp
# Opt level: O2

void check_parse_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  byte bVar1;
  byte *pbVar2;
  pointer puVar3;
  type_conflict9 tVar4;
  semantic_tag sVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  istringstream *options;
  void *__buf;
  byte *pbVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  pointer puVar9;
  json result;
  AssertionHandler catchAssertionHandler_2;
  json j2;
  undefined1 local_4a0 [48];
  string s;
  error_code ec;
  SourceLineInfo local_440;
  StringRef local_430;
  StringRef local_420;
  StringRef local_410;
  istringstream is;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  cbor_bytes_reader reader;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&decoder,(allocator_type *)&reader,(temp_allocator_type *)&is);
  options = &is;
  _is = (_func_int **)(jsoncons::cbor::cbor_decode_options::vtable + 0x18);
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_reader<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>> *)&reader,v,
             &decoder.super_basic_json_visitor<char>,(cbor_decode_options *)options,
             (allocator<char> *)&catchAssertionHandler_2);
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_>::read
            (&reader,(int)&ec,__buf,(size_t)options);
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)&result);
  tVar4 = jsoncons::operator==(&result,expected);
  if (!tVar4) {
    std::operator<<((ostream *)&std::cout,"v: ");
    pbVar2 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pbVar8 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
      bVar1 = *pbVar8;
      poVar6 = std::operator<<((ostream *)&std::cout,"0x");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(poVar6,(uint)bVar1);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"result: ");
    pbVar7 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar6,&result);
    std::operator<<((ostream *)pbVar7,"\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"expected: ");
    pbVar7 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar6,expected);
    std::operator<<((ostream *)pbVar7,"\n");
  }
  catchAssertionHandler_2.m_assertionInfo.macroName.m_start = "REQUIRE";
  catchAssertionHandler_2.m_assertionInfo.macroName.m_size = 7;
  local_4a0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_4a0._8_8_ = (pointer)0x2f;
  Catch::StringRef::StringRef(&local_410,"result == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&is,(StringRef *)&catchAssertionHandler_2,
             (SourceLineInfo *)local_4a0,local_410,Normal);
  local_4a0._0_8_ = (pointer)&result;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&catchAssertionHandler_2,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)local_4a0,expected);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&is,(ITransientExpression *)&catchAssertionHandler_2);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_2);
  Catch::AssertionHandler::complete((AssertionHandler *)&is);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&is);
  catchAssertionHandler_2.m_assertionInfo.macroName.m_start = "CHECK";
  catchAssertionHandler_2.m_assertionInfo.macroName.m_size = 5;
  local_4a0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_4a0._8_8_ = (pointer)0x30;
  Catch::StringRef::StringRef(&local_420,"result.tag() == expected.tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&is,(StringRef *)&catchAssertionHandler_2,
             (SourceLineInfo *)local_4a0,local_420,ContinueOnFailure);
  sVar5 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag(&result);
  local_4a0._0_8_ = &s;
  s._M_dataplus._M_p._0_1_ = sVar5;
  j2.field_0._0_1_ =
       jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag(expected);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)
             &catchAssertionHandler_2,(ExprLhs<jsoncons::semantic_tag_const&> *)local_4a0,
             (semantic_tag *)&j2);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&is,(ITransientExpression *)&catchAssertionHandler_2);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_2);
  Catch::AssertionHandler::complete((AssertionHandler *)&is);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&is);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar9 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1) {
    std::__cxx11::string::push_back((char)&s);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&s,_S_in);
  catchAssertionHandler_2.m_assertionInfo.lineInfo.file._0_4_ = 0x400;
  catchAssertionHandler_2.m_assertionInfo.macroName.m_start =
       jsoncons::cbor::cbor_decode_options::vtable + 0x18;
  catchAssertionHandler_2.m_assertionInfo.macroName.m_size = 0x999f58;
  jsoncons::cbor::
  decode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((cbor *)&j2,(istream *)&is,(cbor_decode_options *)&catchAssertionHandler_2);
  local_4a0._0_8_ = "REQUIRE";
  local_4a0._8_8_ = (pointer)0x7;
  local_440.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_440.line = 0x39;
  Catch::StringRef::StringRef(&local_430,"j2 == expected");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_2,(StringRef *)local_4a0,&local_440,local_430,Normal);
  local_440.file = (char *)&j2;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)local_4a0,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_440,expected);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_2,(ITransientExpression *)local_4a0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_2);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_2);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&j2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&s);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&result);
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_>::
  ~basic_cbor_reader(&reader);
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder(&decoder);
  return;
}

Assistant:

void check_parse_cbor(const std::vector<uint8_t>& v, const json& expected)
{
    JSONCONS_TRY
    {
        std::error_code ec;

        jsoncons::json_decoder<json> decoder;
        cbor_bytes_reader reader(v, decoder);
        reader.read(ec);

        json result = decoder.get_result();

        if (!(result == expected))
        {
            std::cout << "v: ";
            for (auto b : v)
            {
                std::cout << "0x" << std::hex << (int)b;
            }
            std::cout << "\n";
            std::cout << "result: " << result << "\n";
            std::cout << "expected: " << expected << "\n";
        }

        REQUIRE(result == expected);
        CHECK(result.tag() == expected.tag());

        std::string s;
        for (auto c : v)
        {
            s.push_back(c);
        }
        std::istringstream is(s);
        json j2 = decode_cbor<json>(is);
        REQUIRE(j2 == expected);
    }